

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall
despot::TagManhattanUpperBound::TagManhattanUpperBound(TagManhattanUpperBound *this,BaseTag *model)

{
  double dVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int dist;
  Coord opp;
  Coord rob;
  undefined1 local_68 [4];
  int s;
  Floor floor;
  BaseTag *model_local;
  TagManhattanUpperBound *this_local;
  
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  despot::BeliefUpperBound::BeliefUpperBound(&this->super_BeliefUpperBound);
  *(undefined ***)this = &PTR__TagManhattanUpperBound_001597c8;
  *(undefined ***)&this->super_BeliefUpperBound = &PTR__TagManhattanUpperBound_00159808;
  this->tag_model_ = model;
  std::vector<double,_std::allocator<double>_>::vector(&this->value_);
  Floor::Floor((Floor *)local_68,&this->tag_model_->floor_);
  iVar2 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar2);
  _rob = 0;
  while( true ) {
    iVar2 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
    if (iVar2 <= _rob) break;
    std::vector<int,_std::allocator<int>_>::operator[](&this->tag_model_->rob_,(long)_rob);
    uVar3 = despot::Floor::GetCell((int)local_68);
    std::vector<int,_std::allocator<int>_>::operator[](&this->tag_model_->opp_,(long)_rob);
    uVar4 = despot::Floor::GetCell((int)local_68);
    iVar2 = despot::Coord::ManhattanDistance(uVar3,uVar4);
    dVar6 = Globals::Discount(iVar2);
    dVar7 = Globals::Discount();
    dVar1 = BaseTag::TAG_REWARD;
    dVar8 = Globals::Discount(iVar2);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->value_,(long)_rob);
    *pvVar5 = dVar1 * dVar8 + -(1.0 - dVar6) / (1.0 - dVar7);
    _rob = _rob + 1;
  }
  Floor::~Floor((Floor *)local_68);
  return;
}

Assistant:

TagManhattanUpperBound(const BaseTag* model) :
		tag_model_(model) {
		Floor floor = tag_model_->floor_;
		value_.resize(tag_model_->NumStates());
		for (int s = 0; s < tag_model_->NumStates(); s++) {
			Coord rob = floor.GetCell(tag_model_->rob_[s]), opp = floor.GetCell(
				tag_model_->opp_[s]);
			int dist = Coord::ManhattanDistance(rob, opp);
			value_[s] = -(1 - Globals::Discount(dist)) / (1 - Globals::Discount())
				+ tag_model_->TAG_REWARD * Globals::Discount(dist);
		}
	}